

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockstep_scheduler.cpp
# Opt level: O3

int __thiscall
LockstepScheduler::cond_timedwait
          (LockstepScheduler *this,pthread_cond_t *cond,pthread_mutex_t *lock,uint64_t time_us)

{
  mutex *__mutex;
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  int iVar2;
  int iVar3;
  TimedWait *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  int *piVar5;
  undefined8 uVar6;
  bool bVar7;
  shared_ptr<LockstepScheduler::TimedWait> new_timed_wait;
  value_type local_48;
  
  local_48.super___shared_ptr<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_48.super___shared_ptr<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __mutex = &this->timed_waits_mutex_;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    if ((this->time_us_).super___atomic_base<unsigned_long>._M_i < time_us) {
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
      this_00._M_pi =
           local_48.super___shared_ptr<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      p_Var4->_M_use_count = 1;
      p_Var4->_M_weak_count = 1;
      p_Var4->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00109d70;
      local_48.super___shared_ptr<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)(p_Var4 + 1);
      p_Var4[1]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var4[1]._M_use_count = 0;
      p_Var4[1]._M_weak_count = 0;
      p_Var4[2]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var4[2]._M_use_count = 0;
      p_Var4[2]._M_weak_count = 0;
      bVar7 = local_48.super___shared_ptr<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_48.super___shared_ptr<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var4;
      if (bVar7) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
      }
      p_Var4[2]._vptr__Sp_counted_base = (_func_int **)time_us;
      p_Var4[1]._vptr__Sp_counted_base = (_func_int **)cond;
      *(pthread_mutex_t **)&p_Var4[1]._M_use_count = lock;
      std::
      vector<std::shared_ptr<LockstepScheduler::TimedWait>,_std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>_>_>
      ::push_back(&this->timed_waits_,&local_48);
      this->timed_waits_iterator_invalidated_ = true;
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      iVar3 = pthread_cond_wait((pthread_cond_t *)cond,(pthread_mutex_t *)lock);
      pthread_mutex_unlock((pthread_mutex_t *)lock);
      iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
      peVar1 = local_48.super___shared_ptr<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      if (iVar2 != 0) goto LAB_00105ebb;
      if ((iVar3 == 0) &&
         (iVar3 = 0,
         (local_48.super___shared_ptr<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->timeout == true)) {
        piVar5 = __errno_location();
        *piVar5 = 0x6e;
        iVar3 = -1;
      }
      peVar1->done = true;
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      pthread_mutex_lock((pthread_mutex_t *)lock);
    }
    else {
      piVar5 = __errno_location();
      *piVar5 = 0x6e;
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      iVar3 = -1;
    }
    if (local_48.super___shared_ptr<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.
                 super___shared_ptr<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    return iVar3;
  }
  iVar2 = std::__throw_system_error(iVar2);
LAB_00105ebb:
  uVar6 = std::__throw_system_error(iVar2);
  if (local_48.super___shared_ptr<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  _Unwind_Resume(uVar6);
}

Assistant:

int LockstepScheduler::cond_timedwait(pthread_cond_t *cond, pthread_mutex_t *lock, uint64_t time_us)
{
    std::shared_ptr<TimedWait> new_timed_wait;
    {
        std::lock_guard<std::mutex> lock_timed_waits(timed_waits_mutex_);

        // The time has already passed.
        if (time_us <= time_us_) {
            errno = ETIMEDOUT;
            return -1;
        }

        new_timed_wait = std::make_shared<TimedWait>();
        new_timed_wait->time_us = time_us;
        new_timed_wait->passed_cond = cond;
        new_timed_wait->passed_lock = lock;
        timed_waits_.push_back(new_timed_wait);
        timed_waits_iterator_invalidated_ = true;
    }

    while (true) {
        int result = pthread_cond_wait(cond, lock);

        // We need to unlock before aqcuiring the timed_waits_mutex, otherwise
        // we are at rist of priority inversion.
        pthread_mutex_unlock(lock);

        {
            std::lock_guard<std::mutex> lock_timed_waits(timed_waits_mutex_);

            if (result == 0 && new_timed_wait->timeout) {
                errno = ETIMEDOUT;
                result = -1;
            }

            new_timed_wait->done = true;
        }

        // The lock needs to be locked on exit of this function
        pthread_mutex_lock(lock);
        return result;
    }
}